

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
toml::detail::
read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
          (string *__return_storage_ptr__,detail *this,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  syntax_error *psVar1;
  char cVar2;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  uint_least32_t codepoint;
  allocator_type local_26a;
  allocator<char> local_269;
  location<std::vector<char,_std::allocator<char>_>_> *local_268;
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  string local_248;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  istringstream iss;
  uint auStack_188 [90];
  
  region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_((string *)&iss,this);
  std::__cxx11::string::substr((ulong)&str,(ulong)&iss);
  std::__cxx11::string::~string((string *)&iss);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
  *(uint *)((long)auStack_188 + *(long *)(_iss + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_iss + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<unsigned_int>((uint *)&iss);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)__return_storage_ptr__;
  if (0x7f < codepoint) {
    if (codepoint < 0x800) {
      std::__cxx11::string::push_back(cVar2);
    }
    else {
      local_268 = (location<std::vector<char,_std::allocator<char>_>_> *)reg;
      if (codepoint < 0x10000) {
        if ((codepoint & 0xf800) == 0xd800) {
          psVar1 = (syntax_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,
                     "[error] toml::read_utf8_codepoint: codepoints in the range [0xD800, 0xDFFF] are not valid UTF-8."
                     ,&local_269);
          std::
          pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[28],_true>
                    (&local_1e8,&local_268,(char (*) [28])"not a valid UTF-8 codepoint");
          __l._M_len = 1;
          __l._M_array = &local_1e8;
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector(&local_260,__l,&local_26a);
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_228,&local_248,&local_260,&local_208);
          syntax_error::syntax_error(psVar1,&local_228);
          __cxa_throw(psVar1,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        if (0xfffff7ff < codepoint - 0xe000) {
          __assert_fail("codepoint < 0xD800 || 0xDFFF < codepoint",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zxvnme[P]repostruct/src/../toml/toml/parser.hpp"
                        ,0x11b,
                        "std::string toml::detail::read_utf8_codepoint(const region<Container> &, const location<Container2> &) [Container = std::vector<char>, Container2 = std::vector<char>]"
                       );
        }
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        if (0x10ffff < codepoint) {
          psVar1 = (syntax_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,
                     "[error] toml::read_utf8_codepoint: input codepoint is too large.",&local_269);
          std::
          pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[30],_true>
                    (&local_1e8,&local_268,(char (*) [30])"should be in [0x00..0x10FFFF]");
          __l_00._M_len = 1;
          __l_00._M_array = &local_1e8;
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector(&local_260,__l_00,&local_26a);
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_228,&local_248,&local_260,&local_208);
          syntax_error::syntax_error(psVar1,&local_228);
          __cxa_throw(psVar1,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
    }
  }
  std::__cxx11::string::push_back(cVar2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string read_utf8_codepoint(const region<Container>& reg,
              /* for err msg */ const location<Container2>& loc)
{
    const auto str = reg.str().substr(1);
    std::uint_least32_t codepoint;
    std::istringstream iss(str);
    iss >> std::hex >> codepoint;

    const auto to_char = [](const int i) noexcept -> char {
        const auto uc = static_cast<unsigned char>(i);
        return *reinterpret_cast<const char*>(std::addressof(uc));
    };

    std::string character;
    if(codepoint < 0x80) // U+0000 ... U+0079 ; just an ASCII.
    {
        character += static_cast<char>(codepoint);
    }
    else if(codepoint < 0x800) //U+0080 ... U+07FF
    {
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        character += to_char(0xC0| codepoint >> 6);
        character += to_char(0x80|(codepoint & 0x3F));
    }
    else if(codepoint < 0x10000) // U+0800...U+FFFF
    {
        if(0xD800 <= codepoint && codepoint <= 0xDFFF)
        {
            throw syntax_error(format_underline("[error] "
                "toml::read_utf8_codepoint: codepoints in the range "
                "[0xD800, 0xDFFF] are not valid UTF-8.", {{
                    std::addressof(loc), "not a valid UTF-8 codepoint"
                }}));
        }
        assert(codepoint < 0xD800 || 0xDFFF < codepoint);
        // 1110yyyy 10yxxxxx 10xxxxxx
        character += to_char(0xE0| codepoint >> 12);
        character += to_char(0x80|(codepoint >> 6 & 0x3F));
        character += to_char(0x80|(codepoint      & 0x3F));
    }
    else if(codepoint < 0x110000) // U+010000 ... U+10FFFF
    {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        character += to_char(0xF0| codepoint >> 18);
        character += to_char(0x80|(codepoint >> 12 & 0x3F));
        character += to_char(0x80|(codepoint >> 6  & 0x3F));
        character += to_char(0x80|(codepoint       & 0x3F));
    }
    else // out of UTF-8 region
    {
        throw syntax_error(format_underline("[error] toml::read_utf8_codepoint:"
            " input codepoint is too large.",
            {{std::addressof(loc), "should be in [0x00..0x10FFFF]"}}));
    }
    return character;
}